

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_13::NameResolver::BeginIfExpr(NameResolver *this,IfExpr *expr)

{
  IfExpr *expr_local;
  NameResolver *this_local;
  
  PushLabel(this,&(expr->true_).label);
  ResolveBlockDeclarationVar(this,&(expr->true_).decl);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::BeginIfExpr(IfExpr* expr) {
  PushLabel(expr->true_.label);
  ResolveBlockDeclarationVar(&expr->true_.decl);
  return Result::Ok;
}